

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

longlong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryTotal(SystemInformationImplementation *this)

{
  int iVar1;
  SystemInformationImplementation *pSStack_20;
  int ierr;
  longlong memTotal;
  SystemInformationImplementation *this_local;
  
  pSStack_20 = (SystemInformationImplementation *)0x0;
  memTotal = (longlong)this;
  iVar1 = anon_unknown_3::GetFieldFromFile<long_long>
                    ("/proc/meminfo","MemTotal:",(longlong *)&stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    this_local = pSStack_20;
  }
  else {
    this_local = (SystemInformationImplementation *)0xffffffffffffffff;
  }
  return (longlong)this_local;
}

Assistant:

long long SystemInformationImplementation::GetHostMemoryTotal()
{
#if defined(_WIN32)
#  if defined(_MSC_VER) && _MSC_VER < 1300
  MEMORYSTATUS stat;
  stat.dwLength = sizeof(stat);
  GlobalMemoryStatus(&stat);
  return stat.dwTotalPhys / 1024;
#  else
  MEMORYSTATUSEX statex;
  statex.dwLength = sizeof(statex);
  GlobalMemoryStatusEx(&statex);
  return statex.ullTotalPhys / 1024;
#  endif
#elif defined(__linux) || defined(__CYGWIN__)
  long long memTotal = 0;
  int ierr = GetFieldFromFile("/proc/meminfo", "MemTotal:", memTotal);
  if (ierr) {
    return -1;
  }
  return memTotal;
#elif defined(__APPLE__)
  uint64_t mem;
  size_t len = sizeof(mem);
  int ierr = sysctlbyname("hw.memsize", &mem, &len, nullptr, 0);
  if (ierr) {
    return -1;
  }
  return mem / 1024;
#else
  return 0;
#endif
}